

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O0

void __thiscall
cmOSXBundleGenerator::CreateFramework(cmOSXBundleGenerator *this,string *targetName,string *outpath)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  cmLocalGenerator *this_00;
  cmTarget *target;
  bool bVar2;
  char *pcVar3;
  _Self local_290;
  allocator local_281;
  key_type local_280;
  _Self local_260;
  _Self local_258;
  allocator local_249;
  key_type local_248;
  _Self local_228;
  _Self local_220;
  allocator local_211;
  key_type local_210;
  _Self local_1f0;
  string local_1e8 [8];
  string versions;
  string newName;
  string oldName;
  string name;
  string plist;
  allocator local_131;
  value_type local_130;
  undefined1 local_110 [8];
  string frameworkVersion;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_b0 [8];
  string newoutpath;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string contentdir;
  string *outpath_local;
  string *targetName_local;
  cmOSXBundleGenerator *this_local;
  
  contentdir.field_2._8_8_ = outpath;
  bVar2 = MustSkip(this);
  if (!bVar2) {
    if (this->MacContentFolders ==
        (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x0) {
      __assert_fail("this->MacContentFolders",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmOSXBundleGenerator.cxx"
                    ,0x4c,
                    "void cmOSXBundleGenerator::CreateFramework(const std::string &, const std::string &)"
                   );
    }
    std::operator+(&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   contentdir.field_2._8_8_,"/");
    cmTarget::GetFrameworkDirectory(&local_80,this->GT->Target,&this->ConfigName,true);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_60,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::operator+=((string *)local_40,"/");
    std::operator+(&local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   contentdir.field_2._8_8_,"/");
    cmTarget::GetFrameworkDirectory
              ((string *)((long)&frameworkVersion.field_2 + 8),this->GT->Target,&this->ConfigName,
               false);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                   &local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&frameworkVersion.field_2 + 8));
    std::__cxx11::string::~string((string *)(frameworkVersion.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_d0);
    cmTarget::GetFrameworkVersion_abi_cxx11_((string *)local_110,this->GT->Target);
    psVar1 = this->MacContentFolders;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_130,"Resources",&local_131);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(psVar1,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    std::__cxx11::string::string((string *)(name.field_2._M_local_buf + 8),(string *)local_b0);
    std::__cxx11::string::operator+=
              ((string *)(name.field_2._M_local_buf + 8),"/Resources/Info.plist");
    cmsys::SystemTools::GetFilenameName((string *)((long)&oldName.field_2 + 8),targetName);
    this_00 = this->LocalGenerator;
    target = this->GT->Target;
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmLocalGenerator::GenerateFrameworkInfoPList
              (this_00,target,(string *)((long)&oldName.field_2 + 8),pcVar3);
    std::__cxx11::string::string((string *)(newName.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(versions.field_2._M_local_buf + 8));
    std::__cxx11::string::string(local_1e8,(string *)local_40);
    std::__cxx11::string::operator+=(local_1e8,"Versions");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmsys::SystemTools::MakeDirectory(pcVar3);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmsys::SystemTools::MakeDirectory(pcVar3);
    std::__cxx11::string::operator=
              ((string *)(newName.field_2._M_local_buf + 8),(string *)local_110);
    std::__cxx11::string::operator=((string *)(versions.field_2._M_local_buf + 8),local_1e8);
    std::__cxx11::string::operator+=((string *)(versions.field_2._M_local_buf + 8),"/Current");
    cmsys::SystemTools::RemoveFile((string *)((long)&versions.field_2 + 8));
    cmsys::SystemTools::CreateSymlink
              ((string *)((long)&newName.field_2 + 8),(string *)((long)&versions.field_2 + 8));
    cmMakefile::AddCMakeOutputFile(this->Makefile,(string *)((long)&versions.field_2 + 8));
    std::__cxx11::string::operator=
              ((string *)(newName.field_2._M_local_buf + 8),"Versions/Current/");
    std::__cxx11::string::operator+=
              ((string *)(newName.field_2._M_local_buf + 8),
               (string *)(oldName.field_2._M_local_buf + 8));
    std::__cxx11::string::operator=
              ((string *)(versions.field_2._M_local_buf + 8),(string *)local_40);
    std::__cxx11::string::operator+=
              ((string *)(versions.field_2._M_local_buf + 8),
               (string *)(oldName.field_2._M_local_buf + 8));
    cmsys::SystemTools::RemoveFile((string *)((long)&versions.field_2 + 8));
    cmsys::SystemTools::CreateSymlink
              ((string *)((long)&newName.field_2 + 8),(string *)((long)&versions.field_2 + 8));
    cmMakefile::AddCMakeOutputFile(this->Makefile,(string *)((long)&versions.field_2 + 8));
    psVar1 = this->MacContentFolders;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_210,"Resources",&local_211);
    local_1f0._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(psVar1,&local_210);
    local_220._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(this->MacContentFolders);
    bVar2 = std::operator!=(&local_1f0,&local_220);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
    if (bVar2) {
      std::__cxx11::string::operator=
                ((string *)(newName.field_2._M_local_buf + 8),"Versions/Current/Resources");
      std::__cxx11::string::operator=
                ((string *)(versions.field_2._M_local_buf + 8),(string *)local_40);
      std::__cxx11::string::operator+=((string *)(versions.field_2._M_local_buf + 8),"Resources");
      cmsys::SystemTools::RemoveFile((string *)((long)&versions.field_2 + 8));
      cmsys::SystemTools::CreateSymlink
                ((string *)((long)&newName.field_2 + 8),(string *)((long)&versions.field_2 + 8));
      cmMakefile::AddCMakeOutputFile(this->Makefile,(string *)((long)&versions.field_2 + 8));
    }
    psVar1 = this->MacContentFolders;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_248,"Headers",&local_249);
    local_228._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(psVar1,&local_248);
    local_258._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(this->MacContentFolders);
    bVar2 = std::operator!=(&local_228,&local_258);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    if (bVar2) {
      std::__cxx11::string::operator=
                ((string *)(newName.field_2._M_local_buf + 8),"Versions/Current/Headers");
      std::__cxx11::string::operator=
                ((string *)(versions.field_2._M_local_buf + 8),(string *)local_40);
      std::__cxx11::string::operator+=((string *)(versions.field_2._M_local_buf + 8),"Headers");
      cmsys::SystemTools::RemoveFile((string *)((long)&versions.field_2 + 8));
      cmsys::SystemTools::CreateSymlink
                ((string *)((long)&newName.field_2 + 8),(string *)((long)&versions.field_2 + 8));
      cmMakefile::AddCMakeOutputFile(this->Makefile,(string *)((long)&versions.field_2 + 8));
    }
    psVar1 = this->MacContentFolders;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_280,"PrivateHeaders",&local_281);
    local_260._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(psVar1,&local_280);
    local_290._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(this->MacContentFolders);
    bVar2 = std::operator!=(&local_260,&local_290);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator((allocator<char> *)&local_281);
    if (bVar2) {
      std::__cxx11::string::operator=
                ((string *)(newName.field_2._M_local_buf + 8),"Versions/Current/PrivateHeaders");
      std::__cxx11::string::operator=
                ((string *)(versions.field_2._M_local_buf + 8),(string *)local_40);
      std::__cxx11::string::operator+=
                ((string *)(versions.field_2._M_local_buf + 8),"PrivateHeaders");
      cmsys::SystemTools::RemoveFile((string *)((long)&versions.field_2 + 8));
      cmsys::SystemTools::CreateSymlink
                ((string *)((long)&newName.field_2 + 8),(string *)((long)&versions.field_2 + 8));
      cmMakefile::AddCMakeOutputFile(this->Makefile,(string *)((long)&versions.field_2 + 8));
    }
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::string::~string((string *)(versions.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(newName.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(oldName.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_110);
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void cmOSXBundleGenerator::CreateFramework(
  const std::string& targetName, const std::string& outpath)
{
  if (this->MustSkip())
    return;

  assert(this->MacContentFolders);

  // Compute the location of the top-level foo.framework directory.
  std::string contentdir = outpath + "/" +
    this->GT->Target->GetFrameworkDirectory(this->ConfigName, true);
  contentdir += "/";

  std::string newoutpath = outpath + "/" +
    this->GT->Target->GetFrameworkDirectory(this->ConfigName, false);

  std::string frameworkVersion = this->GT->Target->GetFrameworkVersion();

  // Configure the Info.plist file into the Resources directory.
  this->MacContentFolders->insert("Resources");
  std::string plist = newoutpath;
  plist += "/Resources/Info.plist";
  std::string name = cmSystemTools::GetFilenameName(targetName);
  this->LocalGenerator->GenerateFrameworkInfoPList(this->GT->Target,
                                                   name,
                                                   plist.c_str());

  // TODO: Use the cmMakefileTargetGenerator::ExtraFiles vector to
  // drive rules to create these files at build time.
  std::string oldName;
  std::string newName;


  // Make foo.framework/Versions
  std::string versions = contentdir;
  versions += "Versions";
  cmSystemTools::MakeDirectory(versions.c_str());

  // Make foo.framework/Versions/version
  cmSystemTools::MakeDirectory(newoutpath.c_str());

  // Current -> version
  oldName = frameworkVersion;
  newName = versions;
  newName += "/Current";
  cmSystemTools::RemoveFile(newName);
  cmSystemTools::CreateSymlink(oldName, newName);
  this->Makefile->AddCMakeOutputFile(newName);

  // foo -> Versions/Current/foo
  oldName = "Versions/Current/";
  oldName += name;
  newName = contentdir;
  newName += name;
  cmSystemTools::RemoveFile(newName);
  cmSystemTools::CreateSymlink(oldName, newName);
  this->Makefile->AddCMakeOutputFile(newName);

  // Resources -> Versions/Current/Resources
  if(this->MacContentFolders->find("Resources") !=
     this->MacContentFolders->end())
    {
    oldName = "Versions/Current/Resources";
    newName = contentdir;
    newName += "Resources";
    cmSystemTools::RemoveFile(newName);
    cmSystemTools::CreateSymlink(oldName, newName);
    this->Makefile->AddCMakeOutputFile(newName);
    }

  // Headers -> Versions/Current/Headers
  if(this->MacContentFolders->find("Headers") !=
     this->MacContentFolders->end())
    {
    oldName = "Versions/Current/Headers";
    newName = contentdir;
    newName += "Headers";
    cmSystemTools::RemoveFile(newName);
    cmSystemTools::CreateSymlink(oldName, newName);
    this->Makefile->AddCMakeOutputFile(newName);
    }

  // PrivateHeaders -> Versions/Current/PrivateHeaders
  if(this->MacContentFolders->find("PrivateHeaders") !=
     this->MacContentFolders->end())
    {
    oldName = "Versions/Current/PrivateHeaders";
    newName = contentdir;
    newName += "PrivateHeaders";
    cmSystemTools::RemoveFile(newName);
    cmSystemTools::CreateSymlink(oldName, newName);
    this->Makefile->AddCMakeOutputFile(newName);
    }
}